

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export_strings.hpp
# Opt level: O3

void __thiscall
pstore::exchange::export_ns::string_mapping::string_mapping<(pstore::trailer::indices)3>
          (string_mapping *this,database *db)

{
  __hashtable *__this;
  double dVar1;
  shared_ptr<const_pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>_>
  index;
  long local_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  (this->strings_)._M_h._M_buckets = &(this->strings_)._M_h._M_single_bucket;
  (this->strings_)._M_h._M_bucket_count = 1;
  (this->strings_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->strings_)._M_h._M_element_count = 0;
  (this->strings_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->strings_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->strings_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  pstore::index::
  get_index<(pstore::trailer::indices)3,pstore::database_const,pstore::index::hamt_set<pstore::indirect_string,pstore::index::fnv_64a_hash_indirect_string,std::equal_to<pstore::indirect_string>>const>
            ((index *)&local_20,db,true);
  dVar1 = ceil((((double)CONCAT44(0x45300000,(int)((ulong)*(undefined8 *)(local_20 + 0x28) >> 0x20))
                - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)*(undefined8 *)(local_20 + 0x28)) -
               4503599627370496.0)) /
               (double)(this->strings_)._M_h._M_rehash_policy._M_max_load_factor);
  std::
  _Hashtable<pstore::address,_std::pair<const_pstore::address,_unsigned_long>,_std::allocator<std::pair<const_pstore::address,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<pstore::address>,_std::hash<pstore::address>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::rehash((_Hashtable<pstore::address,_std::pair<const_pstore::address,_unsigned_long>,_std::allocator<std::pair<const_pstore::address,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<pstore::address>,_std::hash<pstore::address>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            *)this,(long)(dVar1 - 9.223372036854776e+18) & (long)dVar1 >> 0x3f | (long)dVar1);
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  return;
}

Assistant:

string_mapping (database const & db, index_tag<Index>) {
                    auto const index = index::get_index<Index> (db);
                    strings_.reserve (index->size ());
                }